

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_handshake_api(void)

{
  undefined1 *puVar1;
  ptls_context_t *ppVar2;
  ptls_context_t *ppVar3;
  int iVar4;
  ptls_t *ppVar5;
  ptls_t *ppVar6;
  size_t max_early_data_size;
  size_t coffs [5];
  size_t soffs [5];
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_update_traffic_key_t update_traffic_key;
  size_t inlen;
  st_ptls_raw_message_emitter_t emitter;
  st_ptls_raw_message_emitter_t emitter_1;
  traffic_secrets_t client_secrets;
  traffic_secrets_t server_secrets;
  ptls_buffer_t local_6c8;
  ptls_t *local_6a8;
  ptls_t *local_6a0;
  ptls_buffer_t local_698;
  ptls_t *local_678;
  long local_670;
  size_t local_668 [6];
  undefined1 *local_638;
  undefined1 *local_630;
  size_t local_628 [6];
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  ptls_save_ticket_t local_5e8;
  ptls_encrypt_ticket_t local_5e0;
  ptls_update_traffic_key_t local_5d8;
  ptls_message_emitter_t local_5d0;
  undefined8 local_5a8;
  long local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ptls_iovec_t local_588;
  undefined1 local_578 [104];
  ptls_raw_extension_t *ppStack_510;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *local_508;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_500;
  undefined1 local_4f8 [32];
  code *local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  ptls_raw_extension_t *ppStack_490;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *local_488;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  ptls_iovec_t local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  ptls_iovec_t local_448;
  undefined1 local_438 [128];
  undefined1 auStack_3b8 [64];
  undefined1 auStack_378 [128];
  undefined1 local_2f8 [64];
  undefined1 auStack_2b8 [64];
  undefined1 auStack_278 [64];
  undefined1 local_238 [64];
  undefined1 local_1f8 [64];
  undefined1 auStack_1b8 [64];
  undefined1 auStack_178 [192];
  undefined1 auStack_b8 [64];
  undefined1 auStack_78 [72];
  
  memset(local_438,0,0x200);
  memset(local_238,0,0x200);
  ppVar3 = ctx;
  local_668[4] = 0;
  local_668[2] = 0;
  local_668[3] = 0;
  local_668[0] = 0;
  local_668[1] = 0;
  local_5d8.cb = on_update_traffic_key;
  local_5e0.cb = on_copy_ticket;
  local_5e8.cb = on_save_ticket;
  ctx->private_key_method = &private_key_method;
  ppVar2 = ctx_peer;
  ctx_peer->private_key_method = &private_key_method;
  ppVar3->update_traffic_key = &local_5d8;
  ppVar3->field_0x68 = ppVar3->field_0x68 | 0x10;
  ppVar3->save_ticket = &local_5e8;
  ppVar2->update_traffic_key = &local_5d8;
  ppVar2->field_0x68 = ppVar2->field_0x68 | 0x10;
  ppVar2->encrypt_ticket = &local_5e0;
  ppVar2->ticket_lifetime = 0x15180;
  ppVar2->max_early_data_size = 0x2000;
  saved_ticket = (ptls_iovec_t)ZEXT816(0);
  local_6c8.base = "";
  local_6c8.capacity = 0;
  local_6c8.off = 0;
  local_6c8._24_8_ = (ulong)(uint)local_6c8._28_4_ << 0x20;
  local_698.base = "";
  local_698.capacity = 0;
  local_698.off = 0;
  local_698.is_allocated = 0;
  ppVar5 = ptls_new(ppVar3,0);
  ppVar5->data_ptr = local_438;
  ppVar6 = ptls_new(ctx_peer,1);
  ppVar6->data_ptr = local_238;
  local_578._8_8_ = &(ppVar5->traffic_protection).enc;
  local_578._16_16_ = ZEXT816(0x11636e) << 0x40;
  local_578._32_8_ = commit_raw_message;
  local_578._40_8_ = 0xffffffffffffffff;
  local_6a8 = ppVar5;
  local_578._0_8_ = &local_6c8;
  local_578._48_8_ = local_668;
  iVar4 = send_client_hello(ppVar5,(ptls_message_emitter_t *)local_578,
                            (ptls_handshake_properties_t *)0x0,(ptls_iovec_t *)0x0);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x503);
  local_678 = ppVar6;
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x505);
  _ok((uint)(local_698.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x506);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x507);
  local_6a0 = (ptls_t *)auStack_b8;
  iVar4 = bcmp(local_6a0,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x508);
  local_630 = auStack_78;
  iVar4 = bcmp(local_630,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x509);
  local_638 = auStack_1b8;
  iVar4 = bcmp(local_638,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50a);
  iVar4 = bcmp(auStack_178,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50b);
  ppVar5 = local_6a8;
  iVar4 = feed_messages(local_6a8,&local_6c8,local_668,local_698.base,local_628,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50d);
  _ok((uint)(local_6c8.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50e);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x50f);
  iVar4 = bcmp(auStack_3b8,local_6a0,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x510);
  iVar4 = bcmp(auStack_2b8,local_638,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x511);
  local_5f0 = auStack_378;
  iVar4 = bcmp(local_5f0,local_630,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x512);
  local_5f8 = auStack_278;
  iVar4 = bcmp(auStack_278,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x513);
  ppVar5 = local_678;
  iVar4 = feed_messages(local_678,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x515);
  _ok((uint)(local_698.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x516);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x517);
  iVar4 = bcmp(auStack_278,auStack_178,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x518);
  ptls_free(local_6a8);
  ptls_free(ppVar5);
  local_6c8.off = 0;
  local_698.off = 0;
  memset(local_438,0,0x200);
  memset(local_238,0,0x200);
  ppVar2 = ctx;
  local_668[0] = 0;
  local_668[1] = 0;
  local_668[2] = 0;
  local_668[3] = 0;
  local_668[4] = 0;
  local_628[0] = 0;
  local_628[1] = 0;
  local_628[2] = 0;
  local_628[3] = 0;
  local_628[4] = 0;
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  local_578._32_8_ = &local_670;
  local_670 = 0;
  local_578._40_8_ = 0;
  local_508 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_500 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_578._96_8_ = 0;
  ppStack_510 = (ptls_raw_extension_t *)0x0;
  local_578._80_8_ = (uint8_t *)0x0;
  local_578._88_8_ = 0;
  local_578._64_8_ = 0;
  local_578._72_8_ = (void *)0x0;
  local_578._48_8_ = (uint8_t *)0x0;
  local_578._56_8_ = 0;
  local_578._0_8_ = (ptls_buffer_t *)0x0;
  local_578._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_578._16_8_ = saved_ticket.base;
  local_578._24_8_ = saved_ticket.len;
  ppVar5 = ptls_new(ppVar2,0);
  ppVar5->data_ptr = local_438;
  ppVar6 = ptls_new(ctx_peer,1);
  ppVar6->data_ptr = local_238;
  local_4f8._0_8_ = &local_6c8;
  local_4f8._8_8_ = &(ppVar5->traffic_protection).enc;
  local_4f8._16_8_ = (uint8_t *)0x0;
  local_4f8._24_8_ = begin_raw_message;
  local_4d8 = commit_raw_message;
  uStack_4d0 = 0xffffffffffffffff;
  local_6a8 = ppVar5;
  local_4c8 = local_668;
  iVar4 = send_client_hello(ppVar5,(ptls_message_emitter_t *)local_4f8,
                            (ptls_handshake_properties_t *)local_578,(ptls_iovec_t *)0x0);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x52e);
  _ok((uint)(local_670 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x52f);
  iVar4 = bcmp(local_2f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x530);
  local_678 = ppVar6;
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x532);
  _ok((uint)(local_698.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x533);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x534);
  iVar4 = bcmp(local_2f8,local_1f8,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x535);
  iVar4 = bcmp(local_638,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x536);
  iVar4 = bcmp(local_6a0,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x537);
  puVar1 = local_630;
  iVar4 = bcmp(local_630,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x538);
  iVar4 = bcmp(auStack_178,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x539);
  ppVar5 = local_6a8;
  iVar4 = feed_messages(local_6a8,&local_6c8,local_668,local_698.base,local_628,
                        (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53b);
  _ok((uint)(local_6c8.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53c);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53d);
  iVar4 = bcmp(local_5f0,puVar1,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53e);
  iVar4 = bcmp(local_5f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x53f);
  ppVar5 = local_678;
  iVar4 = feed_messages(local_678,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x541);
  _ok((uint)(local_698.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x542);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x543);
  iVar4 = bcmp(auStack_178,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  ptls_free(local_6a8);
  ptls_free(ppVar5);
  local_6c8.off = 0;
  local_698.off = 0;
  memset(local_438,0,0x200);
  memset(local_238,0,0x200);
  local_668[0] = 0;
  local_668[1] = 0;
  local_668[2] = 0;
  local_668[3] = 0;
  local_668[4] = 0;
  local_628[0] = 0;
  local_628[1] = 0;
  local_628[2] = 0;
  local_628[3] = 0;
  local_628[4] = 0;
  ctx_peer->max_early_data_size = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_578._40_8_ = 0;
  local_578._48_8_ = (uint8_t *)0x0;
  local_578._56_8_ = 0;
  local_578._64_8_ = 0;
  local_578._72_8_ = (void *)0x0;
  local_578._80_8_ = (uint8_t *)0x0;
  local_578._88_8_ = 0;
  local_578._96_8_ = 0;
  ppStack_510 = (ptls_raw_extension_t *)0x0;
  local_508 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_500 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_448 = saved_ticket;
  local_578._0_8_ = (ptls_buffer_t *)0x0;
  local_578._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_578._16_8_ = saved_ticket.base;
  local_578._24_8_ = saved_ticket.len;
  local_578._32_8_ = &local_670;
  ppVar5 = ptls_new(ctx,0);
  ppVar5->data_ptr = local_438;
  ppVar6 = ptls_new(ctx_peer,1);
  ppVar6->data_ptr = local_238;
  local_4f8._0_8_ = &local_6c8;
  local_4f8._8_8_ = &(ppVar5->traffic_protection).enc;
  local_4f8._16_8_ = (uint8_t *)0x0;
  local_4f8._24_8_ = begin_raw_message;
  local_4d8 = commit_raw_message;
  uStack_4d0 = 0xffffffffffffffff;
  local_4c8 = local_668;
  iVar4 = send_client_hello(ppVar5,(ptls_message_emitter_t *)local_4f8,
                            (ptls_handshake_properties_t *)local_578,(ptls_iovec_t *)0x0);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x558);
  _ok((uint)(local_670 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x559);
  iVar4 = bcmp(local_2f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55a);
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55c);
  _ok((uint)(local_698.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55d);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x55e);
  iVar4 = feed_messages(ppVar5,&local_6c8,local_668,local_698.base,local_628,
                        (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x560);
  _ok((uint)(local_6c8.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x561);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x562);
  _ok((uint)(local_578._40_4_ == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x563);
  iVar4 = bcmp(local_1f8,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x564);
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x566);
  _ok((uint)(local_698.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x567);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  ptls_free(ppVar5);
  ptls_free(ppVar6);
  local_6c8.off = 0;
  local_698.off = 0;
  memset(local_438,0,0x200);
  memset(local_238,0,0x200);
  local_668[0] = 0;
  local_668[1] = 0;
  local_668[2] = 0;
  local_668[3] = 0;
  local_668[4] = 0;
  local_628[0] = 0;
  local_628[1] = 0;
  local_628[2] = 0;
  local_628[3] = 0;
  local_628[4] = 0;
  ctx_peer->max_early_data_size = 0x2000;
  ppStack_490 = (ptls_raw_extension_t *)0x0;
  local_488 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_480 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_4a8 = (uint8_t *)0x0;
  uStack_4a0 = 0;
  local_4b8 = 0;
  uStack_4b0 = (void *)0x0;
  local_4c8 = (uint8_t *)0x0;
  uStack_4c0 = 0;
  local_4d8 = (_func_int_st_ptls_message_emitter_t_ptr *)0x0;
  uStack_4d0 = 0;
  local_4f8._16_8_ = (uint8_t *)0x0;
  local_4f8._24_8_ = (_func_int_st_ptls_message_emitter_t_ptr *)0x0;
  local_4f8._0_8_ = (ptls_buffer_t *)0x0;
  local_4f8._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_498 = 1;
  local_598 = 0;
  uStack_590 = 0;
  local_578._40_8_ = 0;
  local_578._48_8_ = (uint8_t *)0x0;
  local_578._56_8_ = 0;
  local_578._64_8_ = 0;
  local_578._72_8_ = (void *)0x0;
  local_578._80_8_ = (uint8_t *)0x0;
  local_578._88_8_ = 0;
  local_578._96_8_ = 0;
  ppStack_510 = (ptls_raw_extension_t *)0x0;
  local_508 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_500 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_588 = saved_ticket;
  local_578._0_8_ = (ptls_buffer_t *)0x0;
  local_578._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_578._16_8_ = saved_ticket.base;
  local_578._24_8_ = saved_ticket.len;
  local_578._32_8_ = &local_670;
  ppVar5 = ptls_new(ctx,0);
  ppVar5->data_ptr = local_438;
  ppVar6 = ptls_new(ctx_peer,1);
  ppVar6->data_ptr = local_238;
  local_5d0.buf = &local_6c8;
  local_5d0.enc = &(ppVar5->traffic_protection).enc;
  local_5d0.record_header_length = 0;
  local_5d0.begin_message = begin_raw_message;
  local_5d0.commit_message = commit_raw_message;
  local_5a8 = 0xffffffffffffffff;
  local_6a0 = ppVar5;
  local_5a0 = (long)local_668;
  iVar4 = send_client_hello(ppVar5,&local_5d0,(ptls_handshake_properties_t *)local_578,
                            (ptls_iovec_t *)0x0);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x57e);
  _ok((uint)(local_670 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x57f);
  iVar4 = bcmp(local_2f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x580);
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)local_4f8);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x582);
  _ok((uint)(local_698.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x583);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x584);
  ppVar5 = local_6a0;
  iVar4 = feed_messages(local_6a0,&local_6c8,local_668,local_698.base,local_628,
                        (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x586);
  _ok((uint)(local_6c8.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x587);
  _ok((uint)(ppVar5->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x588);
  _ok((uint)(local_578._40_4_ == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x589);
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)local_4f8);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58b);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58c);
  iVar4 = bcmp(local_1f8,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58d);
  _ok((uint)(local_698.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x58e);
  ppVar5 = local_6a0;
  iVar4 = feed_messages(local_6a0,&local_6c8,local_668,local_698.base,local_628,
                        (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x590);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x591);
  _ok((uint)(local_6c8.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x592);
  iVar4 = feed_messages(ppVar6,&local_698,local_628,local_6c8.base,local_668,
                        (ptls_handshake_properties_t *)local_4f8);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x594);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  ptls_free(ppVar5);
  ptls_free(ppVar6);
  ppVar3 = ctx;
  local_6c8.off = 0;
  local_698.off = 0;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  puVar1 = &ppVar3->field_0x68;
  *puVar1 = *puVar1 & 0xef;
  ppVar2 = ctx_peer;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ppVar2->field_0x68 = ppVar2->field_0x68 & 0xef;
  local_478 = 0;
  uStack_470 = 0;
  local_578._40_8_ = 0;
  local_578._48_8_ = (uint8_t *)0x0;
  local_578._56_8_ = 0;
  local_578._64_8_ = 0;
  local_578._72_8_ = (void *)0x0;
  local_578._80_8_ = (uint8_t *)0x0;
  local_578._88_8_ = 0;
  local_578._96_8_ = 0;
  ppStack_510 = (ptls_raw_extension_t *)0x0;
  local_508 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_500 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_468 = saved_ticket;
  local_578._0_8_ = (ptls_buffer_t *)0x0;
  local_578._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_578._16_8_ = saved_ticket.base;
  local_578._24_8_ = saved_ticket.len;
  local_578._32_8_ = &local_670;
  local_4f8._0_8_ = (ptls_buffer_t *)0x0;
  local_4f8._8_8_ = (st_ptls_traffic_protection_t *)0x0;
  local_4f8._16_8_ = (uint8_t *)0x0;
  local_4f8._24_8_ = (_func_int_st_ptls_message_emitter_t_ptr *)0x0;
  local_4d8 = (_func_int_st_ptls_message_emitter_t_ptr *)0x0;
  uStack_4d0 = 0;
  local_4c8 = (uint8_t *)0x0;
  uStack_4c0 = 0;
  local_4b8 = 0;
  uStack_4b0 = (void *)0x0;
  local_4a8 = (uint8_t *)0x0;
  uStack_4a0 = 0;
  ppStack_490 = (ptls_raw_extension_t *)0x0;
  local_488 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_480 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)
                0x0;
  local_498 = 1;
  ppVar5 = ptls_new(ppVar3,0);
  ppVar6 = ptls_new(ctx_peer,1);
  iVar4 = ptls_handshake(ppVar5,&local_6c8,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5a8);
  _ok((uint)((_func_int_st_ptls_message_emitter_t_ptr *)local_578._32_8_ !=
            (_func_int_st_ptls_message_emitter_t_ptr *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5a9);
  _ok((uint)(local_578._40_4_ == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5aa);
  _ok((uint)((ptls_buffer_t *)local_6c8.off != (ptls_buffer_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ab);
  iVar4 = ptls_send(ppVar5,&local_6c8,"hello world",0xb);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ad);
  local_5d0.buf = (ptls_buffer_t *)local_6c8.off;
  iVar4 = ptls_handshake(ppVar6,&local_698,local_6c8.base,(size_t *)&local_5d0,
                         (ptls_handshake_properties_t *)local_4f8);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b0);
  _ok((uint)((ptls_buffer_t *)local_6c8.off == local_5d0.buf),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b1);
  local_6c8.off = 0;
  _ok((uint)((ptls_buffer_t *)local_698.off != (ptls_buffer_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b3);
  local_5d0.buf = (ptls_buffer_t *)local_698.off;
  iVar4 = ptls_handshake(ppVar5,&local_6c8,local_698.base,(size_t *)&local_5d0,
                         (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b6);
  _ok((uint)(local_578._40_4_ == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b7);
  _ok((uint)((ptls_buffer_t *)local_698.off == local_5d0.buf),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5b8);
  local_698.off = 0;
  _ok((uint)((ptls_buffer_t *)local_6c8.off != (ptls_buffer_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ba);
  local_5d0.buf = (ptls_buffer_t *)local_6c8.off;
  do {
    iVar4 = ptls_handshake(ppVar6,&local_698,local_6c8.base,(size_t *)&local_5d0,
                           (ptls_handshake_properties_t *)local_4f8);
  } while ((ppVar6->field_0x160 & 0x20) != 0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5bf);
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c0);
  _ok((uint)((ptls_buffer_t *)local_6c8.off == local_5d0.buf),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c1);
  local_6c8.off = 0;
  _ok((uint)((ptls_buffer_t *)local_698.off != (ptls_buffer_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c3);
  local_5d0.buf = (ptls_buffer_t *)local_698.off;
  iVar4 = ptls_handshake(ppVar5,&local_6c8,local_698.base,(size_t *)&local_5d0,
                         (ptls_handshake_properties_t *)local_578);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c6);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c7);
  _ok((uint)(local_5d0.buf < local_698.off),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5c8);
  local_698.off = 0;
  local_5d0.buf = (ptls_buffer_t *)local_6c8.off;
  do {
    iVar4 = ptls_handshake(ppVar6,&local_698,local_6c8.base,(size_t *)&local_5d0,
                           (ptls_handshake_properties_t *)local_4f8);
  } while ((ppVar6->field_0x160 & 0x20) != 0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5ce);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x5cf);
  _ok((uint)(local_698.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c");
  ptls_free(ppVar5);
  ptls_free(ppVar6);
  (*ptls_clear_memory)(local_6c8.base,local_6c8.off);
  if (local_6c8.is_allocated != 0) {
    free(local_6c8.base);
  }
  local_6c8.off = 0;
  local_6c8.is_allocated = 0;
  local_6c8._28_4_ = 0;
  local_6c8.base = (uint8_t *)0x0;
  local_6c8.capacity = 0;
  (*ptls_clear_memory)(local_698.base,local_698.off);
  if (local_698.is_allocated != 0) {
    free(local_698.base);
  }
  ppVar2 = ctx;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  puVar1 = &ppVar2->field_0x68;
  *puVar1 = *puVar1 & 0xef;
  ppVar2->save_ticket = (ptls_save_ticket_t *)0x0;
  ppVar2 = ctx_peer;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ppVar2->field_0x68 = ppVar2->field_0x68 & 0xef;
  ppVar2->ticket_lifetime = 0;
  ppVar2->max_early_data_size = 0;
  ppVar2->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ppVar2->save_ticket = (ptls_save_ticket_t *)0x0;
  return;
}

Assistant:

static void test_handshake_api(void)
{
    ptls_t *client, *server;
    traffic_secrets_t client_secrets = {{{0}}}, server_secrets = {{{0}}};
    ptls_buffer_t cbuf, sbuf;
    size_t coffs[5] = {0}, soffs[5];
    ptls_update_traffic_key_t update_traffic_key = {on_update_traffic_key};
    ptls_encrypt_ticket_t encrypt_ticket = {on_copy_ticket};
    ptls_save_ticket_t save_ticket = {on_save_ticket};
    int ret;

    ctx->private_key_method = &private_key_method;
    ctx_peer->private_key_method = &private_key_method;

    ctx->update_traffic_key = &update_traffic_key;
    ctx->omit_end_of_early_data = 1;
    ctx->save_ticket = &save_ticket;
    ctx_peer->update_traffic_key = &update_traffic_key;
    ctx_peer->omit_end_of_early_data = 1;
    ctx_peer->encrypt_ticket = &encrypt_ticket;
    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;

    saved_ticket = ptls_iovec_init(NULL, 0);

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);

    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;

    /* full handshake */
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][2], server_secrets[1][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][2], server_secrets[0][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][3], server_secrets[0][3], PTLS_MAX_DIGEST_SIZE) == 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    ctx->save_ticket = NULL; /* don't allow further test to update the saved ticket */

    /* 0-RTT resumption */
    size_t max_early_data_size = 0;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][1], server_secrets[0][1], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0); /* !!!overlap!!! */
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* 0-RTT rejection */
    ctx_peer->max_early_data_size = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* HRR rejects 0-RTT */
    ctx_peer->max_early_data_size = 8192;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* HRR  -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);
    ok(!ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> SH..SF */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ok(sbuf.off != 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(cbuf.off != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;

    /* shamelessly reuse this subtest for testing ordinary TLS 0-RTT with HRR rejection */
    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    server_hs_prop = (ptls_handshake_properties_t){{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.max_early_data_size != 0);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(cbuf.off != 0);
    ret = ptls_send(client, &cbuf, "hello world", 11); /* send 0-RTT data that'll be rejected */
    ok(ret == 0);
    size_t inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* HRR -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(sbuf.off == inlen);
    sbuf.off = 0;
    ok(cbuf.off != 0);
    inlen = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> SH..SF,NST */
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(inlen < sbuf.off); /* ignore NST */
    sbuf.off = 0;
    inlen = cbuf.off;
    do
        ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CF -> */
    while (ptls_handshake_in_private_key(server));
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(sbuf.off == 0);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);

    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx->save_ticket = NULL;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->save_ticket = NULL;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
}